

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.cpp
# Opt level: O0

void __thiscall
sc_core::sc_signal<bool,_(sc_core::sc_writer_policy)1>::update
          (sc_signal<bool,_(sc_core::sc_writer_policy)1> *this)

{
  sc_writer_policy_check_delta *in_RDI;
  sc_signal<bool,_(sc_core::sc_writer_policy)1> *unaff_retaddr;
  
  sc_writer_policy_check_delta::update(in_RDI);
  if ((in_RDI[0xb].super_sc_writer_policy_check_write.field_0x1 & 1) !=
      (in_RDI[0xb].super_sc_writer_policy_check_write.m_delta_only & 1U)) {
    do_update(unaff_retaddr);
  }
  return;
}

Assistant:

void
sc_signal<bool,POL>::update()
{
    policy_type::update();
    if( !( base_type::m_new_val == base_type::m_cur_val ) ) {
        do_update();
    }
}